

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

void __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeExpVec(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *vec,DataArray<int> *vecExp)

{
  pointer pnVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  pointer pnVar5;
  multiprecision *pmVar6;
  byte bVar7;
  multiprecision local_130 [112];
  int local_c0;
  undefined1 local_bc;
  int *local_b8;
  type local_b0;
  
  bVar7 = 0;
  uVar4 = 0;
  while (pnVar1 = (vec->
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(vec->
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar1 >> 7)) {
    pnVar5 = pnVar1 + uVar4;
    pmVar6 = local_130;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(uint *)pmVar6 = (pnVar5->m_backend).data._M_elems[0];
      pnVar5 = (pointer)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
      pmVar6 = pmVar6 + (ulong)bVar7 * -8 + 4;
    }
    local_c0 = pnVar1[uVar4].m_backend.exp;
    local_bc = pnVar1[uVar4].m_backend.neg;
    local_b8 = *(int **)&pnVar1[uVar4].m_backend.fpclass;
    iVar2 = (int)uVar4;
    boost::multiprecision::
    frexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_b0,local_130,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(vecExp->data + iVar2),local_b8);
    vecExp->data[iVar2] = vecExp->data[iVar2] + -1;
    uVar4 = (ulong)(iVar2 + 1);
  }
  return;
}

Assistant:

void SPxScaler<R>::computeExpVec(const std::vector<R>& vec, DataArray<int>& vecExp)
{
   assert(vec.size() == unsigned(vecExp.size()));

   for(unsigned i = 0; i < vec.size(); ++i)
   {
      spxFrexp(vec[i], &(vecExp[int(i)]));
      vecExp[int(i)] -= 1;
   }
}